

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char ** SoapySDRDevice_listClockSources(SoapySDRDevice *device,size_t *length)

{
  char **ppcVar1;
  size_t *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  exception *ex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_30 [16];
  size_t in_stack_ffffffffffffffe0;
  
  *in_RSI = 0;
  SoapySDRDevice_clearError();
  (**(code **)((in_RDI->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 0x268))(local_30);
  ppcVar1 = toStrArray(in_RDI,in_RSI,in_stack_ffffffffffffffe0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffc0);
  return ppcVar1;
}

Assistant:

char **SoapySDRDevice_listClockSources(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listClockSources(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}